

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MiniscriptParser.cpp
# Opt level: O3

Value __thiscall
MiniScript::Parser::ParseMap(Parser *this,Lexer *tokens,bool asLval,bool statementStart)

{
  bool *pbVar1;
  int iVar2;
  ParseState *this_00;
  Token *pTVar3;
  Type TVar4;
  bool bVar5;
  uint uVar6;
  long *plVar7;
  undefined7 in_register_00000011;
  Lexer *this_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX;
  anon_union_8_3_2f476f46_for_data extraout_RDX_00;
  anon_union_8_3_2f476f46_for_data extraout_RDX_01;
  anon_union_8_3_2f476f46_for_data extraout_RDX_02;
  anon_union_8_3_2f476f46_for_data extraout_RDX_03;
  anon_union_8_3_2f476f46_for_data extraout_RDX_04;
  anon_union_8_3_2f476f46_for_data extraout_RDX_05;
  anon_union_8_3_2f476f46_for_data extraout_RDX_06;
  anon_union_8_3_2f476f46_for_data extraout_RDX_07;
  anon_union_8_3_2f476f46_for_data extraout_RDX_08;
  anon_union_8_3_2f476f46_for_data aVar8;
  anon_union_8_3_2f476f46_for_data extraout_RDX_09;
  long *plVar9;
  Parser *pPVar10;
  Parser *this_02;
  Value VVar11;
  Value *result;
  Value value;
  Value key;
  anon_union_8_3_2f476f46_for_data local_1f0;
  Value local_1e8;
  Value local_1d8;
  Value local_1c8;
  String local_1b8;
  String local_1a8;
  Parser *local_198;
  Parser *local_190;
  Lexer local_188;
  Lexer local_180;
  Lexer local_178;
  Lexer local_170;
  undefined1 local_168 [16];
  Token local_158;
  Lexer local_138;
  Lexer local_130;
  Lexer local_128;
  undefined1 local_120 [16];
  TACLine local_110;
  Token local_b0;
  Token local_90;
  Token local_70;
  Token local_50;
  
  this_01 = (Lexer *)CONCAT71(in_register_00000011,asLval);
  local_198 = this;
  local_190 = (Parser *)tokens;
  Lexer::Peek(&local_158,this_01);
  TVar4 = local_158.type;
  if ((local_158.text.ss != (StringStorage *)0x0) && (local_158.text.isTemp == false)) {
    plVar7 = &((local_158.text.ss)->super_RefCountedStorage).refCount;
    *plVar7 = *plVar7 + -1;
    if (*plVar7 == 0) {
      (*((local_158.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
    }
  }
  pPVar10 = local_198;
  if (TVar4 == LCurly) {
    Lexer::Dequeue(&local_50,this_01);
    this_02 = local_190;
    if ((local_50.text.ss != (StringStorage *)0x0) && (local_50.text.isTemp == false)) {
      plVar7 = &((local_50.text.ss)->super_RefCountedStorage).refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*((local_50.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
      local_50.text.ss = (StringStorage *)0x0;
    }
    Lexer::Peek(&local_158,this_01);
    TVar4 = local_158.type;
    if ((local_158.text.ss != (StringStorage *)0x0) && (local_158.text.isTemp == false)) {
      plVar7 = &((local_158.text.ss)->super_RefCountedStorage).refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*((local_158.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
      }
    }
    if (TVar4 == RCurly) {
      Lexer::Dequeue(&local_70,this_01);
      if ((local_70.text.ss == (StringStorage *)0x0) || (local_70.text.isTemp != false)) {
        local_1f0.number = 0.0;
      }
      else {
        pTVar3 = &local_70;
        local_1f0.number = 0.0;
LAB_00171ab9:
        plVar7 = &((local_70.text.ss)->super_RefCountedStorage).refCount;
        *plVar7 = *plVar7 + -1;
        if (*plVar7 == 0) {
          (*((local_70.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        }
        (pTVar3->text).ss = (StringStorage *)0x0;
      }
    }
    else {
      local_1f0.number = 0.0;
      do {
        local_178.ls = this_01->ls;
        if (local_178.ls != (LexerStorage *)0x0) {
          (local_178.ls)->refCount = (local_178.ls)->refCount + 1;
        }
        AllowLineBreak(&local_178);
        Lexer::release(&local_178);
        Lexer::Peek(&local_158,this_01);
        TVar4 = local_158.type;
        if ((local_158.text.ss != (StringStorage *)0x0) && (local_158.text.isTemp == false)) {
          plVar7 = &((local_158.text.ss)->super_RefCountedStorage).refCount;
          *plVar7 = *plVar7 + -1;
          if (*plVar7 == 0) {
            (*((local_158.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
        }
        if (TVar4 == RCurly) {
          Lexer::Dequeue(&local_90,this_01);
          if ((local_90.text.ss != (StringStorage *)0x0) && (local_90.text.isTemp == false)) {
            pTVar3 = &local_90;
            local_70.text.ss = local_90.text.ss;
            goto LAB_00171ab9;
          }
          break;
        }
        local_128.ls = this_01->ls;
        if (local_128.ls != (LexerStorage *)0x0) {
          (local_128.ls)->refCount = (local_128.ls)->refCount + 1;
        }
        ParseExpr((Parser *)local_120,(Lexer *)this_02,SUB81(&local_128,0),false);
        Lexer::release(&local_128);
        local_180.ls = this_01->ls;
        if (local_180.ls != (LexerStorage *)0x0) {
          (local_180.ls)->refCount = (local_180.ls)->refCount + 1;
        }
        local_1a8.ss = (StringStorage *)0x0;
        local_1a8.isTemp = false;
        RequireToken(&local_b0,this_02,&local_180,Colon,&local_1a8);
        if ((local_b0.text.ss != (StringStorage *)0x0) && (local_b0.text.isTemp == false)) {
          plVar7 = &((local_b0.text.ss)->super_RefCountedStorage).refCount;
          *plVar7 = *plVar7 + -1;
          if (*plVar7 == 0) {
            (*((local_b0.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_b0.text.ss = (StringStorage *)0x0;
        }
        if ((local_1a8.ss != (StringStorage *)0x0) && (local_1a8.isTemp == false)) {
          plVar7 = &((local_1a8.ss)->super_RefCountedStorage).refCount;
          *plVar7 = *plVar7 + -1;
          if (*plVar7 == 0) {
            (*((local_1a8.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_1a8.ss = (StringStorage *)0x0;
        }
        Lexer::release(&local_180);
        local_130.ls = this_01->ls;
        if (local_130.ls != (LexerStorage *)0x0) {
          (local_130.ls)->refCount = (local_130.ls)->refCount + 1;
        }
        AllowLineBreak(&local_130);
        Lexer::release(&local_130);
        local_138.ls = this_01->ls;
        if ((ParseState *)local_138.ls != (ParseState *)0x0) {
          (((ParseState *)local_138.ls)->code).ls =
               (ListStorage<MiniScript::TACLine> *)
               ((long)&(((((ParseState *)local_138.ls)->code).ls)->super_RefCountedStorage).
                       _vptr_RefCountedStorage + 1);
        }
        ParseExpr((Parser *)local_168,(Lexer *)this_02,SUB81(&local_138,0),false);
        Lexer::release(&local_138);
        uVar6 = HashValue((Value *)local_120);
        if (local_1f0.ref == (RefCountedStorage *)0x0) {
          local_1f0.ref = (RefCountedStorage *)operator_new(0x800);
          (local_1f0.ref)->refCount = 1;
          (local_1f0.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__DictionaryStorage_001bf208;
          memset(local_1f0.ref + 1,0,0x7f0);
        }
        plVar9 = &local_1f0.ref[1].refCount + uVar6 % 0xfb;
        plVar7 = plVar9;
        do {
          plVar7 = (long *)*plVar7;
          if (plVar7 == (long *)0x0) {
            plVar7 = (long *)operator_new(0x28);
            *(undefined2 *)(plVar7 + 3) = 0;
            *(undefined1 *)((long)plVar7 + 0x1a) = 0;
            *plVar7 = 0;
            *(undefined4 *)((long)plVar7 + 7) = 0;
            Value::operator=((Value *)(plVar7 + 1),(Value *)local_120);
            Value::operator=((Value *)(plVar7 + 3),(Value *)local_168);
            *plVar7 = *plVar9;
            *plVar9 = (long)plVar7;
            local_1f0.ref[1]._vptr_RefCountedStorage =
                 (_func_int **)((long)local_1f0.ref[1]._vptr_RefCountedStorage + 1);
            goto LAB_0017196a;
          }
          bVar5 = Value::operator==((Value *)(plVar7 + 1),(Value *)local_120);
        } while (!bVar5);
        Value::operator=((Value *)(plVar7 + 3),(Value *)local_168);
LAB_0017196a:
        this_02 = local_190;
        local_188.ls = this_01->ls;
        if (local_188.ls != (LexerStorage *)0x0) {
          (local_188.ls)->refCount = (local_188.ls)->refCount + 1;
        }
        local_1b8.ss = (StringStorage *)0x0;
        local_1b8.isTemp = false;
        RequireEitherToken(&local_158,local_190,&local_188,Comma,RCurly,&local_1b8);
        TVar4 = local_158.type;
        if ((local_158.text.ss != (StringStorage *)0x0) && (local_158.text.isTemp == false)) {
          plVar7 = &((local_158.text.ss)->super_RefCountedStorage).refCount;
          *plVar7 = *plVar7 + -1;
          if (*plVar7 == 0) {
            (*((local_158.text.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_158.text.ss = (StringStorage *)0x0;
        }
        if ((local_1b8.ss != (StringStorage *)0x0) && (local_1b8.isTemp == false)) {
          plVar7 = &((local_1b8.ss)->super_RefCountedStorage).refCount;
          *plVar7 = *plVar7 + -1;
          if (*plVar7 == 0) {
            (*((local_1b8.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
          }
          local_1b8.ss = (StringStorage *)0x0;
        }
        Lexer::release(&local_188);
        if ((Temp < local_168[0]) &&
           ((RefCountedStorage *)local_168._8_8_ != (RefCountedStorage *)0x0)) {
          plVar7 = (long *)(local_168._8_8_ + 8);
          *plVar7 = *plVar7 + -1;
          if (*plVar7 == 0) {
            (*(*(_func_int ***)local_168._8_8_)[1])();
          }
        }
        if ((2 < local_120[0]) && ((long *)local_120._8_8_ != (long *)0x0)) {
          plVar7 = (long *)(local_120._8_8_ + 8);
          *plVar7 = *plVar7 + -1;
          if (*plVar7 == 0) {
            (**(code **)(*(long *)local_120._8_8_ + 8))();
          }
        }
      } while (TVar4 != RCurly);
    }
    pPVar10 = local_198;
    this_00 = this_02->output;
    iVar2 = this_00->nextTempNum;
    this_00->nextTempNum = iVar2 + 1;
    *(undefined2 *)&(local_198->errorContext).ss = 2;
    *(undefined1 *)((long)&(local_198->errorContext).ss + 2) = 0;
    *(int *)&(local_198->errorContext).isTemp = iVar2;
    local_1c8.type = Temp;
    local_1c8.noInvoke = false;
    local_1c8.localOnly = Off;
    local_1c8.data = *(anon_union_8_3_2f476f46_for_data *)&(local_198->errorContext).isTemp;
    local_1d8.type = Map;
    local_1d8.noInvoke = false;
    local_1d8.localOnly = Off;
    if (local_1f0.ref == (RefCountedStorage *)0x0) {
      local_1f0.ref = (RefCountedStorage *)operator_new(0x800);
      (local_1f0.ref)->refCount = 1;
      (local_1f0.ref)->_vptr_RefCountedStorage = (_func_int **)&PTR__DictionaryStorage_001bf208;
      memset(local_1f0.ref + 1,0,0x7f0);
    }
    (local_1f0.ref)->refCount = (local_1f0.ref)->refCount + 1;
    local_1e8.type = Value::null;
    local_1e8.noInvoke = DAT_001c1321;
    local_1e8.localOnly = DAT_001c1322;
    local_1e8.data.ref = DAT_001c1328;
    if (DAT_001c1328 != (RefCountedStorage *)0x0 && Temp < Value::null) {
      DAT_001c1328->refCount = DAT_001c1328->refCount + 1;
    }
    local_1d8.data = local_1f0;
    TACLine::TACLine(&local_110,&local_1c8,CopyA,&local_1d8,&local_1e8);
    ParseState::Add(this_00,&local_110);
    aVar8 = extraout_RDX_00;
    if ((local_110.location.context.ss != (StringStorage *)0x0) &&
       (local_110.location.context.isTemp == false)) {
      plVar7 = &((local_110.location.context.ss)->super_RefCountedStorage).refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*((local_110.location.context.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        aVar8 = extraout_RDX_01;
      }
      local_110.location.context.ss = (StringStorage *)0x0;
    }
    if ((local_110.comment.ss != (StringStorage *)0x0) && (local_110.comment.isTemp == false)) {
      plVar7 = &((local_110.comment.ss)->super_RefCountedStorage).refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*((local_110.comment.ss)->super_RefCountedStorage)._vptr_RefCountedStorage[1])();
        aVar8 = extraout_RDX_02;
      }
      local_110.comment.ss = (StringStorage *)0x0;
    }
    if ((2 < local_110.rhsB.type) && (local_110.rhsB.data.ref != (RefCountedStorage *)0x0)) {
      plVar7 = &(local_110.rhsB.data.ref)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*(local_110.rhsB.data.ref)->_vptr_RefCountedStorage[1])();
        aVar8 = extraout_RDX_03;
      }
      local_110.rhsB.data.number = 0.0;
    }
    if ((2 < local_110.rhsA.type) && ((ParseState *)local_110.rhsA.data.ref != (ParseState *)0x0)) {
      pbVar1 = (bool *)&(local_110.rhsA.data.ref)->refCount;
      *(long *)pbVar1 = *(long *)pbVar1 + -1;
      if (*(long *)pbVar1 == 0) {
        (*(code *)(((List<MiniScript::TACLine> *)&(local_110.rhsA.data.ref)->_vptr_RefCountedStorage
                   )->ls->super_RefCountedStorage).refCount)();
        aVar8 = extraout_RDX_04;
      }
      local_110.rhsA.data.number = 0.0;
    }
    if ((Temp < local_110.lhs.type) && (local_110.lhs.data.ref != (RefCountedStorage *)0x0)) {
      plVar7 = &(local_110.lhs.data.ref)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*(local_110.lhs.data.ref)->_vptr_RefCountedStorage[1])();
        aVar8 = extraout_RDX_05;
      }
      local_110.lhs.data.number = 0.0;
    }
    if ((Temp < local_1e8.type) && (local_1e8.data.ref != (RefCountedStorage *)0x0)) {
      plVar7 = &(local_1e8.data.ref)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*(local_1e8.data.ref)->_vptr_RefCountedStorage[1])();
        aVar8 = extraout_RDX_06;
      }
      local_1e8.data.number = 0.0;
    }
    if ((Temp < local_1d8.type) && (local_1d8.data.ref != (RefCountedStorage *)0x0)) {
      plVar7 = &(local_1d8.data.ref)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*(local_1d8.data.ref)->_vptr_RefCountedStorage[1])();
        aVar8 = extraout_RDX_07;
      }
      local_1d8.data.number = 0.0;
    }
    if ((Temp < local_1c8.type) && (local_1c8.data.ref != (RefCountedStorage *)0x0)) {
      plVar7 = &(local_1c8.data.ref)->refCount;
      *plVar7 = *plVar7 + -1;
      if (*plVar7 == 0) {
        (*(local_1c8.data.ref)->_vptr_RefCountedStorage[1])();
        aVar8 = extraout_RDX_08;
      }
      local_1c8.data.number = 0.0;
    }
    plVar7 = &(local_1f0.ref)->refCount;
    *plVar7 = *plVar7 + -1;
    if (*plVar7 == 0) {
      (*(local_1f0.ref)->_vptr_RefCountedStorage[1])();
      aVar8 = extraout_RDX_09;
    }
  }
  else {
    local_170.ls = this_01->ls;
    if (local_170.ls != (LexerStorage *)0x0) {
      (local_170.ls)->refCount = (local_170.ls)->refCount + 1;
    }
    ParseList(local_198,(Lexer *)local_190,SUB81(&local_170,0),statementStart);
    Lexer::release(&local_170);
    aVar8 = extraout_RDX;
  }
  VVar11.data.number = aVar8.number;
  VVar11._0_8_ = pPVar10;
  return VVar11;
}

Assistant:

Value Parser::ParseMap(Lexer tokens, bool asLval, bool statementStart) {
		Value (Parser::*nextLevel)(Lexer tokens, bool asLval, bool statementStart) = &Parser::ParseList;
		if (tokens.Peek().type != Token::Type::LCurly) return (*this.*nextLevel)(tokens, asLval, statementStart);
		tokens.Dequeue();
		// NOTE: we must be sure this map gets created at runtime, not here at parse time.
		// Since it is a mutable object, we need to return a different one each time
		// this code executes (in a loop, function, etc.).  So, we use Op.CopyA below!
		ValueDict map;
		if (tokens.Peek().type == Token::Type::RCurly) {
			tokens.Dequeue();
		} else while (true) {
			AllowLineBreak(tokens); // allow a line break after a comma or open brace
			
			// Allow the map to close with a } on its own line.
			if (tokens.Peek().type == Token::Type::RCurly) {
				tokens.Dequeue();
				break;
			}

			Value key = ParseExpr(tokens);
			RequireToken(tokens, Token::Type::Colon);
			AllowLineBreak(tokens); // allow a line break after a colon
			Value value = ParseExpr(tokens);

			map.SetValue(key, value);

			if (RequireEitherToken(tokens, Token::Type::Comma, Token::Type::RCurly).type == Token::Type::RCurly) break;
		}
		Value result = Value::Temp(output->nextTempNum++);
		output->Add(TACLine(result, TACLine::Op::CopyA, map));
		return result;
	}